

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O3

void re_build_char(re_context *ctx,re_machine *machine,char ch)

{
  re_tuple *prVar1;
  re_state_id rVar2;
  
  rVar2 = re_alloc_state(ctx);
  machine->init = rVar2;
  rVar2 = re_alloc_state(ctx);
  machine->final = rVar2;
  prVar1 = ctx->tuple_arr + machine->init;
  if (ctx->tuple_arr[machine->init].next_state_1 == -1) {
    if ((prVar1->flags & 6) == 0) {
      prVar1->ch = ch;
    }
    prVar1->next_state_1 = rVar2;
  }
  else {
    prVar1->next_state_2 = rVar2;
  }
  return;
}

Assistant:

static void re_build_char(re_context *ctx, re_machine *machine, char ch)
{
    /* initialize our new machine */
    re_init_machine(ctx, machine);

    /* allocate a transition tuple for the new state */
    re_set_trans(ctx, machine->init, machine->final, ch);
}